

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O3

void __thiscall Ptex::v2_4::PtexReaderCache::purge(PtexReaderCache *this,PtexCachedReader *reader)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  LOCK();
  bVar6 = reader->_refCount == 0;
  if (bVar6) {
    reader->_refCount = -1;
  }
  UNLOCK();
  if (bVar6) {
    PtexReader::purge(&reader->super_PtexReader);
    sVar2 = (reader->super_PtexReader)._memUsed;
    sVar3 = reader->_memUsedAccountedFor;
    reader->_memUsedAccountedFor = sVar2;
    reader->_refCount = 0;
    lVar4 = sVar2 - sVar3;
    if (lVar4 != 0) {
      LOCK();
      psVar1 = &this->_memUsed;
      sVar2 = *psVar1;
      *psVar1 = *psVar1 + lVar4;
      UNLOCK();
      uVar5 = sVar2 + lVar4;
      if (sVar2 + lVar4 < this->_peakMemUsed) {
        uVar5 = this->_peakMemUsed;
      }
      this->_peakMemUsed = uVar5;
    }
  }
  else {
    (reader->super_PtexReader)._pendingPurge = true;
  }
  return;
}

Assistant:

void PtexReaderCache::purge(PtexCachedReader* reader)
{
    size_t memUsedChange;
    if (reader->tryPurge(memUsedChange)) {
        adjustMemUsed(memUsedChange);
    }
}